

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O1

void __thiscall
pbrt::
InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>::
InlinedVector(InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>
              *this,size_t count,Point3<float> *value,
             polymorphic_allocator<pbrt::Point3<float>_> *alloc)

{
  long lVar1;
  size_t sVar2;
  anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
  *paVar3;
  
  (this->alloc).memoryResource = alloc->memoryResource;
  this->ptr = (Point3<float> *)0x0;
  this->nAlloc = 0;
  this->nStored = 0;
  reserve(this,count);
  if (count != 0) {
    lVar1 = 0;
    sVar2 = count;
    do {
      paVar3 = (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
                *)this->ptr;
      if ((anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)this->ptr ==
          (anon_union_192_1_a7e8d694_for_InlinedVector<pbrt::Point3<float>,_16,_pstd::pmr::polymorphic_allocator<pbrt::Point3<float>_>_>_5
           *)0x0) {
        paVar3 = &this->field_2;
      }
      *(float *)((long)paVar3 + lVar1 + 8) = (value->super_Tuple3<pbrt::Point3,_float>).z;
      *(undefined8 *)((long)paVar3 + lVar1) =
           *(undefined8 *)&value->super_Tuple3<pbrt::Point3,_float>;
      lVar1 = lVar1 + 0xc;
      sVar2 = sVar2 - 1;
    } while (sVar2 != 0);
  }
  this->nStored = count;
  return;
}

Assistant:

InlinedVector(size_t count, const T &value, const Allocator &alloc = {})
        : alloc(alloc) {
        reserve(count);
        for (size_t i = 0; i < count; ++i)
            this->alloc.template construct<T>(begin() + i, value);
        nStored = count;
    }